

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::PrintRawArrayTo<int>(int *a,size_t cnt,iu_ostream *os)

{
  ulong local_28;
  size_t i;
  iu_ostream *os_local;
  size_t cnt_local;
  int *a_local;
  
  UniversalPrint<int>(a,os);
  for (local_28 = 1; local_28 < cnt; local_28 = local_28 + 1) {
    std::operator<<(os,", ");
    UniversalPrint<int>(a + local_28,os);
  }
  return;
}

Assistant:

inline void PrintRawArrayTo(const T* a, size_t cnt, iu_ostream* os)
{
    UniversalPrint<T>(a[0], os);
    for( size_t i=1; i < cnt; ++i )
    {
        *os << ", ";
        UniversalPrint<T>(a[i], os);
    }
}